

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O2

void toml::detail::
     throw_bad_cast<(toml::value_t)4,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
               (string *funcname,value_t actual,
               basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *v)

{
  type_error *this;
  char (*args_1) [13];
  value_t *in_R8;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  value_t actual_local;
  allocator_type local_1c2;
  char local_1c1;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c0;
  string local_1a8;
  string local_188;
  string local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  source_location local_130;
  source_location local_e0;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  
  actual_local = actual;
  this = (type_error *)__cxa_allocate_exception(0x78);
  args_1 = (char (*) [13])&local_1c1;
  local_1c1 = '\x04';
  concat_to_string<std::__cxx11::string_const&,char_const(&)[13],toml::value_t>
            (&local_188,(toml *)funcname,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"bad_cast to ",
             args_1,in_R8);
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location(&local_e0,v);
  concat_to_string<char_const(&)[20],toml::value_t&>
            (&local_1a8,(toml *)"the actual type is ",(char (*) [20])&actual_local,(value_t *)args_1
            );
  std::
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_90,&local_e0,&local_1a8);
  __l._M_len = 1;
  __l._M_array = &local_90;
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_1c0,__l,&local_1c2);
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  format_underline(&local_168,&local_188,&local_1c0,&local_148,false);
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::location(&local_130,v);
  type_error::type_error(this,&local_168,&local_130);
  __cxa_throw(this,&type_error::typeinfo,type_error::~type_error);
}

Assistant:

[[noreturn]] inline void
throw_bad_cast(const std::string& funcname, value_t actual, const Value& v)
{
    throw type_error(detail::format_underline(
        concat_to_string(funcname, "bad_cast to ", Expected), {
            {v.location(), concat_to_string("the actual type is ", actual)}
        }), v.location());
}